

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.h
# Opt level: O0

string * __thiscall xLearn::CrossEntropyLoss::loss_type_abi_cxx11_(CrossEntropyLoss *this)

{
  string *in_RDI;
  allocator local_11 [17];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"log_loss",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string loss_type() { return "log_loss"; }